

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

UBool icu_63::enumNames(UCharNames *names,UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,
                       void *context,UCharNameChoice nameChoice)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  UBool UVar4;
  uint uVar5;
  ushort *puVar6;
  ushort *puVar7;
  int iVar8;
  uint end;
  uint uVar9;
  uint start_00;
  
  puVar6 = getGroup(names,start);
  uVar9 = (uint)start >> 5 & 0xffff;
  start_00 = start;
  if (nameChoice == U_EXTENDED_CHAR_NAME && uVar9 < *puVar6) {
    start_00 = (uint)*puVar6 * 0x20;
    if (limit <= (int)start_00) {
      start_00 = limit;
    }
    UVar4 = enumExtNames(start,start_00 - 1,fn,context);
    if (UVar4 == '\0') {
      return '\0';
    }
  }
  end = limit - 1;
  uVar5 = end >> 5 & 0xffff;
  if (uVar9 == uVar5) {
    if (*puVar6 != (uint16_t)((uint)start >> 5)) {
      uVar9 = start_00;
      if (nameChoice != U_EXTENDED_CHAR_NAME) {
        return '\x01';
      }
      goto LAB_0035d17d;
    }
    uVar1 = puVar6[2];
    uVar2 = puVar6[1];
LAB_0035d138:
    UVar4 = enumGroupNames((icu_63 *)names,(UCharNames *)(ulong)uVar2,(uint16_t *)(ulong)uVar1,
                           start_00,end,fn,context,nameChoice);
  }
  else {
    puVar7 = (ushort *)
             ((long)&names->tokenStringOffset +
             (ulong)*(ushort *)((long)&names->tokenStringOffset + (ulong)names->groupsOffset) * 6 +
             (ulong)names->groupsOffset + 2);
    if (uVar9 == *puVar6) {
      if ((start_00 & 0x1f) != 0) {
        UVar4 = enumGroupNames((icu_63 *)names,(UCharNames *)(ulong)puVar6[1],
                               (uint16_t *)(ulong)puVar6[2],start_00,uVar9 << 5 | 0x1f,fn,context,
                               nameChoice);
        if (UVar4 == '\0') {
          return '\0';
        }
        puVar6 = puVar6 + 3;
      }
    }
    else if (((*puVar6 < uVar9) && (puVar6 = puVar6 + 3, puVar6 < puVar7)) &&
            (uVar9 < *puVar6 && nameChoice == U_EXTENDED_CHAR_NAME)) {
      iVar8 = (uint)*puVar6 << 5;
      if (limit <= iVar8) {
        iVar8 = limit;
      }
      UVar4 = enumExtNames(start_00,iVar8 + -1,fn,context);
      if (UVar4 == '\0') {
        return '\0';
      }
    }
    if (puVar6 < puVar7) {
      uVar1 = *puVar6;
      puVar3 = puVar6;
      while (uVar1 < uVar5) {
        puVar6 = puVar3 + 3;
        start_00 = (uint)uVar1 * 0x20;
        UVar4 = enumGroupNames((icu_63 *)names,(UCharNames *)(ulong)puVar3[1],
                               (uint16_t *)(ulong)puVar3[2],start_00,start_00 + 0x1f,fn,context,
                               nameChoice);
        if (UVar4 == '\0') {
          return '\0';
        }
        if (puVar7 <= puVar6) goto LAB_0035d159;
        if (nameChoice == U_EXTENDED_CHAR_NAME) {
          if (*puVar3 + 1 < (uint)*puVar6) {
            iVar8 = (uint)*puVar6 << 5;
            if (limit <= iVar8) {
              iVar8 = limit;
            }
            UVar4 = enumExtNames((uint)*puVar3 * 0x20 + 0x20,iVar8 + -1,fn,context);
            if (UVar4 == '\0') {
              return '\0';
            }
          }
        }
        puVar3 = puVar6;
        uVar1 = *puVar6;
      }
      puVar6 = puVar3;
      if (uVar1 == (ushort)(end >> 5)) {
        start_00 = end & 0xffffffe0;
        uVar1 = puVar3[2];
        uVar2 = puVar3[1];
        goto LAB_0035d138;
      }
    }
LAB_0035d159:
    UVar4 = '\x01';
    if ((nameChoice == U_EXTENDED_CHAR_NAME) && (UVar4 = '\x01', puVar6 == puVar7)) {
      uVar9 = (uint)puVar6[-3] * 0x20 + 0x20;
      if ((int)uVar9 <= (int)start_00) {
        uVar9 = start_00;
      }
LAB_0035d17d:
      iVar8 = 0x110000;
      if (limit < 0x110000) {
        iVar8 = limit;
      }
      UVar4 = enumExtNames(uVar9,iVar8 + -1,fn,context);
      return UVar4;
    }
  }
  return UVar4;
}

Assistant:

static UBool
enumNames(UCharNames *names,
          UChar32 start, UChar32 limit,
          UEnumCharNamesFn *fn, void *context,
          UCharNameChoice nameChoice) {
    uint16_t startGroupMSB, endGroupMSB, groupCount;
    const uint16_t *group, *groupLimit;

    startGroupMSB=(uint16_t)(start>>GROUP_SHIFT);
    endGroupMSB=(uint16_t)((limit-1)>>GROUP_SHIFT);

    /* find the group that contains start, or the highest before it */
    group=getGroup(names, start);

    if(startGroupMSB<group[GROUP_MSB] && nameChoice==U_EXTENDED_CHAR_NAME) {
        /* enumerate synthetic names between start and the group start */
        UChar32 extLimit=((UChar32)group[GROUP_MSB]<<GROUP_SHIFT);
        if(extLimit>limit) {
            extLimit=limit;
        }
        if(!enumExtNames(start, extLimit-1, fn, context)) {
            return FALSE;
        }
        start=extLimit;
    }

    if(startGroupMSB==endGroupMSB) {
        if(startGroupMSB==group[GROUP_MSB]) {
            /* if start and limit-1 are in the same group, then enumerate only in that one */
            return enumGroupNames(names, group, start, limit-1, fn, context, nameChoice);
        }
    } else {
        const uint16_t *groups=GET_GROUPS(names);
        groupCount=*groups++;
        groupLimit=groups+groupCount*GROUP_LENGTH;

        if(startGroupMSB==group[GROUP_MSB]) {
            /* enumerate characters in the partial start group */
            if((start&GROUP_MASK)!=0) {
                if(!enumGroupNames(names, group,
                                   start, ((UChar32)startGroupMSB<<GROUP_SHIFT)+LINES_PER_GROUP-1,
                                   fn, context, nameChoice)) {
                    return FALSE;
                }
                group=NEXT_GROUP(group); /* continue with the next group */
            }
        } else if(startGroupMSB>group[GROUP_MSB]) {
            /* make sure that we start enumerating with the first group after start */
            const uint16_t *nextGroup=NEXT_GROUP(group);
            if (nextGroup < groupLimit && nextGroup[GROUP_MSB] > startGroupMSB && nameChoice == U_EXTENDED_CHAR_NAME) {
                UChar32 end = nextGroup[GROUP_MSB] << GROUP_SHIFT;
                if (end > limit) {
                    end = limit;
                }
                if (!enumExtNames(start, end - 1, fn, context)) {
                    return FALSE;
                }
            }
            group=nextGroup;
        }

        /* enumerate entire groups between the start- and end-groups */
        while(group<groupLimit && group[GROUP_MSB]<endGroupMSB) {
            const uint16_t *nextGroup;
            start=(UChar32)group[GROUP_MSB]<<GROUP_SHIFT;
            if(!enumGroupNames(names, group, start, start+LINES_PER_GROUP-1, fn, context, nameChoice)) {
                return FALSE;
            }
            nextGroup=NEXT_GROUP(group);
            if (nextGroup < groupLimit && nextGroup[GROUP_MSB] > group[GROUP_MSB] + 1 && nameChoice == U_EXTENDED_CHAR_NAME) {
                UChar32 end = nextGroup[GROUP_MSB] << GROUP_SHIFT;
                if (end > limit) {
                    end = limit;
                }
                if (!enumExtNames((group[GROUP_MSB] + 1) << GROUP_SHIFT, end - 1, fn, context)) {
                    return FALSE;
                }
            }
            group=nextGroup;
        }

        /* enumerate within the end group (group[GROUP_MSB]==endGroupMSB) */
        if(group<groupLimit && group[GROUP_MSB]==endGroupMSB) {
            return enumGroupNames(names, group, (limit-1)&~GROUP_MASK, limit-1, fn, context, nameChoice);
        } else if (nameChoice == U_EXTENDED_CHAR_NAME && group == groupLimit) {
            UChar32 next = (PREV_GROUP(group)[GROUP_MSB] + 1) << GROUP_SHIFT;
            if (next > start) {
                start = next;
            }
        } else {
            return TRUE;
        }
    }

    /* we have not found a group, which means everything is made of
       extended names. */
    if (nameChoice == U_EXTENDED_CHAR_NAME) {
        if (limit > UCHAR_MAX_VALUE + 1) {
            limit = UCHAR_MAX_VALUE + 1;
        }
        return enumExtNames(start, limit - 1, fn, context);
    }
    
    return TRUE;
}